

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::InstancePrimitive> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  iterator __position;
  Instance *pIVar7;
  long lVar8;
  AffineSpace3ff *pAVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int *piVar31;
  char *pcVar32;
  ulong uVar33;
  size_t sVar34;
  ulong uVar35;
  long lVar36;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar37;
  undefined1 auVar38 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar66;
  float fVar67;
  undefined1 auVar63 [16];
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float local_a8;
  MutexSys *local_90;
  ulong local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  MutexSys *local_58;
  char local_50;
  ThreadLocal2 *local_48;
  ThreadLocal2 *local_40;
  char local_38;
  undefined1 auVar40 [16];
  
  uVar4 = current->_begin;
  uStack_70 = local_78;
  local_78 = (int *)current;
  uVar5 = current->_end;
  local_88 = (ulong)(uVar5 - uVar4);
  local_90 = (MutexSys *)(local_88 << 4);
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  this_01 = pTVar6->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_38 = '\x01';
    local_40 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_58 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_50 = '\x01';
    local_48 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_48);
    }
    else {
      *__position._M_current = local_48;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_50 == '\x01') {
      MutexSys::unlock(local_58);
    }
    if (local_38 == '\x01') {
      MutexSys::unlock(&local_40->mutex);
    }
  }
  pTVar6->bytesUsed = (long)&local_90->mutex + pTVar6->bytesUsed;
  sVar34 = pTVar6->cur;
  uVar35 = (ulong)(-(int)sVar34 & 0xf);
  uVar33 = (long)&local_90->mutex + uVar35 + sVar34;
  pTVar6->cur = uVar33;
  if (pTVar6->end < uVar33) {
    pTVar6->cur = sVar34;
    if ((MutexSys *)pTVar6->allocBlockSize < (MutexSys *)((long)local_90 << 2)) {
      pcVar32 = (char *)FastAllocator::malloc(this_00,(size_t)&local_90);
    }
    else {
      local_58 = (MutexSys *)pTVar6->allocBlockSize;
      pcVar32 = (char *)FastAllocator::malloc(this_00,(size_t)&local_58);
      pTVar6->ptr = pcVar32;
      sVar34 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar34;
      pTVar6->cur = 0;
      pTVar6->end = (size_t)local_58;
      pTVar6->cur = (size_t)local_90;
      if (local_58 < local_90) {
        pTVar6->cur = 0;
        local_58 = (MutexSys *)pTVar6->allocBlockSize;
        pcVar32 = (char *)FastAllocator::malloc(this_00,(size_t)&local_58);
        pTVar6->ptr = pcVar32;
        sVar34 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar34;
        pTVar6->cur = 0;
        pTVar6->end = (size_t)local_58;
        pTVar6->cur = (size_t)local_90;
        if (local_58 < local_90) {
          pTVar6->cur = 0;
          pcVar32 = (char *)0x0;
          goto LAB_00cd2f16;
        }
      }
      pTVar6->bytesWasted = sVar34;
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar35;
    pcVar32 = pTVar6->ptr + (uVar33 - (long)local_90);
  }
LAB_00cd2f16:
  piVar31 = local_78;
  aVar39 = _DAT_01feba00;
  aVar37 = _DAT_01feba00;
  if (uVar5 == uVar4) {
    auVar38 = DAT_01feb9f0._0_12_;
  }
  else {
    pIVar7 = this->mesh;
    lVar36 = 0;
    auVar40 = _DAT_01feb9f0;
    do {
      if ((pIVar7->super_Geometry).field_8.field_0x1 == '\x01') {
        pAVar9 = pIVar7->local2world;
        fVar41 = (pAVar9->p).field_0.m128[3];
        fVar44 = (pAVar9->l).vx.field_0.m128[3];
        fVar45 = (pAVar9->l).vy.field_0.m128[3];
        fVar50 = (pAVar9->l).vz.field_0.m128[3];
        aVar3 = (pAVar9->l).vx.field_0.field_1;
        fVar78 = (pAVar9->l).vy.field_0.m128[0];
        fVar80 = (pAVar9->l).vy.field_0.m128[1];
        fVar56 = fVar44 * fVar45 + fVar41 * fVar50;
        fVar49 = fVar44 * fVar45 - fVar41 * fVar50;
        fVar58 = fVar41 * fVar41 + fVar44 * fVar44 + -fVar45 * fVar45 + -fVar50 * fVar50;
        fVar82 = fVar41 * fVar41 - fVar44 * fVar44;
        fVar60 = fVar45 * fVar45 + fVar82 + -fVar50 * fVar50;
        fVar46 = fVar44 * fVar50 - fVar41 * fVar45;
        fVar54 = fVar41 * fVar45 + fVar44 * fVar50;
        fVar51 = fVar45 * fVar50 + fVar41 * fVar44;
        fVar77 = fVar45 * fVar50 - fVar41 * fVar44;
        fVar48 = fVar50 * fVar50 + fVar82 + -fVar45 * fVar45;
        fVar41 = (pAVar9->l).vz.field_0.m128[0];
        fVar44 = (pAVar9->l).vz.field_0.m128[1];
        fVar45 = (pAVar9->l).vz.field_0.m128[2];
        fVar56 = fVar56 + fVar56;
        fVar46 = fVar46 + fVar46;
        fVar50 = (pAVar9->p).field_0.m128[0];
        fVar82 = (pAVar9->p).field_0.m128[1];
        fVar47 = (pAVar9->p).field_0.m128[2];
        fVar49 = fVar49 + fVar49;
        fVar51 = fVar51 + fVar51;
        fVar54 = fVar54 + fVar54;
        fVar77 = fVar77 + fVar77;
        fVar79 = fVar58 * 1.0 + fVar56 * 0.0 + fVar46 * 0.0;
        fVar81 = fVar58 * 0.0 + fVar56 * 1.0 + fVar46 * 0.0;
        fVar52 = fVar58 * 0.0 + fVar56 * 0.0 + fVar46 * 1.0;
        fVar53 = fVar58 * 0.0 + fVar56 * 0.0 + fVar46 * 0.0;
        fVar56 = fVar49 * 1.0 + fVar60 * 0.0 + fVar51 * 0.0;
        fVar58 = fVar49 * 0.0 + fVar60 * 1.0 + fVar51 * 0.0;
        fVar59 = fVar49 * 0.0 + fVar60 * 0.0 + fVar51 * 1.0;
        fVar60 = fVar49 * 0.0 + fVar60 * 0.0 + fVar51 * 0.0;
        fVar66 = fVar54 * 1.0 + fVar77 * 0.0 + fVar48 * 0.0;
        fVar67 = fVar54 * 0.0 + fVar77 * 1.0 + fVar48 * 0.0;
        fVar68 = fVar54 * 0.0 + fVar77 * 0.0 + fVar48 * 1.0;
        fVar77 = fVar54 * 0.0 + fVar77 * 0.0 + fVar48 * 0.0;
        local_a8 = aVar3.x;
        fVar46 = local_a8 * fVar79 + fVar56 * 0.0 + fVar66 * 0.0;
        fVar48 = local_a8 * fVar81 + fVar58 * 0.0 + fVar67 * 0.0;
        fVar49 = local_a8 * fVar52 + fVar59 * 0.0 + fVar68 * 0.0;
        fVar51 = local_a8 * fVar53 + fVar60 * 0.0 + fVar77 * 0.0;
        lVar8 = *(long *)&(pIVar7->super_Geometry).field_0x58;
        local_78._0_4_ = aVar3.y;
        local_78._4_4_ = aVar3.z;
        fVar55 = fVar78 * fVar79 + fVar80 * fVar56 + fVar66 * 0.0;
        fVar62 = fVar78 * fVar81 + fVar80 * fVar58 + fVar67 * 0.0;
        fVar72 = fVar78 * fVar52 + fVar80 * fVar59 + fVar68 * 0.0;
        fVar75 = fVar78 * fVar53 + fVar80 * fVar60 + fVar77 * 0.0;
        fVar76 = fVar41 * fVar79 + fVar44 * fVar56 + fVar45 * fVar66;
        fVar84 = fVar41 * fVar81 + fVar44 * fVar58 + fVar45 * fVar67;
        fVar83 = fVar41 * fVar52 + fVar44 * fVar59 + fVar45 * fVar68;
        fVar85 = fVar41 * fVar53 + fVar44 * fVar60 + fVar45 * fVar77;
        fVar44 = fVar50 * fVar79 + fVar82 * fVar56 + fVar47 * fVar66 + (float)local_78 + 0.0;
        fVar78 = fVar50 * fVar81 + fVar82 * fVar58 + fVar47 * fVar67 + local_78._4_4_ + 0.0;
        fVar80 = fVar50 * fVar52 + fVar82 * fVar59 + fVar47 * fVar68 +
                 (pAVar9->l).vy.field_0.m128[2] + 0.0;
        fVar47 = fVar50 * fVar53 + fVar82 * fVar60 + fVar47 * fVar77 + 0.0;
        auVar42 = minps(*(undefined1 (*) [16])(lVar8 + 0x10),*(undefined1 (*) [16])(lVar8 + 0x30));
        auVar61 = maxps(*(undefined1 (*) [16])(lVar8 + 0x20),*(undefined1 (*) [16])(lVar8 + 0x40));
        fVar60 = auVar42._0_4_;
        fVar67 = auVar42._4_4_;
        fVar41 = auVar42._8_4_;
        fVar66 = fVar41 * fVar76 + fVar44;
        fVar68 = fVar41 * fVar84 + fVar78;
        fVar69 = fVar41 * fVar83 + fVar80;
        fVar70 = fVar41 * fVar85 + fVar47;
        fVar71 = fVar67 * fVar55;
        fVar73 = fVar67 * fVar62;
        fVar74 = fVar67 * fVar72;
        fVar67 = fVar67 * fVar75;
        fVar77 = fVar71 + fVar66;
        fVar79 = fVar73 + fVar68;
        fVar81 = fVar74 + fVar69;
        fVar52 = fVar67 + fVar70;
        fVar56 = fVar60 * fVar46;
        fVar58 = fVar60 * fVar48;
        fVar59 = fVar60 * fVar49;
        fVar60 = fVar60 * fVar51;
        fVar41 = fVar56 + fVar77;
        fVar45 = fVar58 + fVar79;
        fVar50 = fVar59 + fVar81;
        fVar82 = fVar60 + fVar52;
        auVar42._4_4_ = fVar45;
        auVar42._0_4_ = fVar41;
        auVar42._8_4_ = fVar50;
        auVar42._12_4_ = fVar82;
        auVar42 = minps(_DAT_01feb9f0,auVar42);
        auVar63._4_4_ = fVar45;
        auVar63._0_4_ = fVar41;
        auVar63._8_4_ = fVar50;
        auVar63._12_4_ = fVar82;
        auVar63 = maxps((undefined1  [16])aVar39,auVar63);
        fVar53 = auVar61._0_4_;
        fVar54 = auVar61._4_4_;
        fVar41 = auVar61._8_4_;
        fVar44 = fVar41 * fVar76 + fVar44;
        fVar78 = fVar41 * fVar84 + fVar78;
        fVar80 = fVar41 * fVar83 + fVar80;
        fVar47 = fVar41 * fVar85 + fVar47;
        fVar71 = fVar71 + fVar44;
        fVar73 = fVar73 + fVar78;
        fVar74 = fVar74 + fVar80;
        fVar67 = fVar67 + fVar47;
        fVar41 = fVar56 + fVar71;
        fVar45 = fVar58 + fVar73;
        fVar50 = fVar59 + fVar74;
        fVar82 = fVar60 + fVar67;
        auVar19._4_4_ = fVar45;
        auVar19._0_4_ = fVar41;
        auVar19._8_4_ = fVar50;
        auVar19._12_4_ = fVar82;
        auVar42 = minps(auVar42,auVar19);
        auVar20._4_4_ = fVar45;
        auVar20._0_4_ = fVar41;
        auVar20._8_4_ = fVar50;
        auVar20._12_4_ = fVar82;
        auVar63 = maxps(auVar63,auVar20);
        fVar55 = fVar54 * fVar55;
        fVar62 = fVar54 * fVar62;
        fVar72 = fVar54 * fVar72;
        fVar54 = fVar54 * fVar75;
        fVar66 = fVar66 + fVar55;
        fVar68 = fVar68 + fVar62;
        fVar69 = fVar69 + fVar72;
        fVar70 = fVar70 + fVar54;
        fVar41 = fVar56 + fVar66;
        fVar45 = fVar58 + fVar68;
        fVar50 = fVar59 + fVar69;
        fVar82 = fVar60 + fVar70;
        auVar21._4_4_ = fVar45;
        auVar21._0_4_ = fVar41;
        auVar21._8_4_ = fVar50;
        auVar21._12_4_ = fVar82;
        auVar42 = minps(auVar42,auVar21);
        auVar22._4_4_ = fVar45;
        auVar22._0_4_ = fVar41;
        auVar22._8_4_ = fVar50;
        auVar22._12_4_ = fVar82;
        auVar63 = maxps(auVar63,auVar22);
        fVar55 = fVar55 + fVar44;
        fVar62 = fVar62 + fVar78;
        fVar72 = fVar72 + fVar80;
        fVar54 = fVar54 + fVar47;
        fVar56 = fVar56 + fVar55;
        fVar58 = fVar58 + fVar62;
        fVar59 = fVar59 + fVar72;
        fVar60 = fVar60 + fVar54;
        auVar61._4_4_ = fVar58;
        auVar61._0_4_ = fVar56;
        auVar61._8_4_ = fVar59;
        auVar61._12_4_ = fVar60;
        auVar42 = minps(auVar42,auVar61);
        auVar16._4_4_ = fVar58;
        auVar16._0_4_ = fVar56;
        auVar16._8_4_ = fVar59;
        auVar16._12_4_ = fVar60;
        auVar63 = maxps(auVar63,auVar16);
        fVar46 = fVar53 * fVar46;
        fVar48 = fVar53 * fVar48;
        fVar49 = fVar53 * fVar49;
        fVar53 = fVar53 * fVar51;
        fVar77 = fVar77 + fVar46;
        fVar79 = fVar79 + fVar48;
        fVar81 = fVar81 + fVar49;
        fVar52 = fVar52 + fVar53;
        auVar17._4_4_ = fVar79;
        auVar17._0_4_ = fVar77;
        auVar17._8_4_ = fVar81;
        auVar17._12_4_ = fVar52;
        auVar42 = minps(auVar42,auVar17);
        auVar18._4_4_ = fVar79;
        auVar18._0_4_ = fVar77;
        auVar18._8_4_ = fVar81;
        auVar18._12_4_ = fVar52;
        auVar63 = maxps(auVar63,auVar18);
        fVar71 = fVar71 + fVar46;
        fVar73 = fVar73 + fVar48;
        fVar74 = fVar74 + fVar49;
        fVar67 = fVar67 + fVar53;
        auVar25._4_4_ = fVar73;
        auVar25._0_4_ = fVar71;
        auVar25._8_4_ = fVar74;
        auVar25._12_4_ = fVar67;
        auVar42 = minps(auVar42,auVar25);
        auVar26._4_4_ = fVar73;
        auVar26._0_4_ = fVar71;
        auVar26._8_4_ = fVar74;
        auVar26._12_4_ = fVar67;
        auVar63 = maxps(auVar63,auVar26);
        auVar65._0_4_ = fVar66 + fVar46;
        auVar65._4_4_ = fVar68 + fVar48;
        auVar65._8_4_ = fVar69 + fVar49;
        auVar65._12_4_ = fVar70 + fVar53;
        auVar42 = minps(auVar42,auVar65);
        auVar63 = maxps(auVar63,auVar65);
        auVar57._0_4_ = fVar46 + fVar55;
        auVar57._4_4_ = fVar48 + fVar62;
        auVar57._8_4_ = fVar49 + fVar72;
        auVar57._12_4_ = fVar53 + fVar54;
        auVar42 = minps(auVar42,auVar57);
        auVar63 = maxps(auVar63,auVar57);
      }
      else {
        lVar8 = *(long *)&(pIVar7->super_Geometry).field_0x58;
        pAVar9 = pIVar7->local2world;
        fVar41 = (pAVar9->l).vx.field_0.m128[0];
        fVar44 = (pAVar9->l).vx.field_0.m128[1];
        fVar45 = (pAVar9->l).vx.field_0.m128[2];
        fVar50 = (pAVar9->l).vx.field_0.m128[3];
        fVar78 = (pAVar9->l).vy.field_0.m128[0];
        fVar80 = (pAVar9->l).vy.field_0.m128[1];
        fVar82 = (pAVar9->l).vy.field_0.m128[2];
        fVar47 = (pAVar9->l).vy.field_0.m128[3];
        fVar46 = (pAVar9->l).vz.field_0.m128[0];
        fVar48 = (pAVar9->l).vz.field_0.m128[1];
        fVar49 = (pAVar9->l).vz.field_0.m128[2];
        fVar51 = (pAVar9->l).vz.field_0.m128[3];
        fVar56 = (pAVar9->p).field_0.m128[0];
        fVar58 = (pAVar9->p).field_0.m128[1];
        fVar59 = (pAVar9->p).field_0.m128[2];
        fVar60 = (pAVar9->p).field_0.m128[3];
        auVar63 = minps(*(undefined1 (*) [16])(lVar8 + 0x10),*(undefined1 (*) [16])(lVar8 + 0x30));
        auVar42 = maxps(*(undefined1 (*) [16])(lVar8 + 0x20),*(undefined1 (*) [16])(lVar8 + 0x40));
        fVar55 = auVar63._0_4_;
        fVar72 = auVar63._4_4_;
        fVar77 = auVar63._8_4_;
        fVar62 = fVar77 * fVar46 + fVar56;
        fVar66 = fVar77 * fVar48 + fVar58;
        fVar67 = fVar77 * fVar49 + fVar59;
        fVar68 = fVar77 * fVar51 + fVar60;
        fVar69 = fVar72 * fVar78;
        fVar70 = fVar72 * fVar80;
        fVar71 = fVar72 * fVar82;
        fVar72 = fVar72 * fVar47;
        fVar73 = fVar69 + fVar62;
        fVar74 = fVar70 + fVar66;
        fVar75 = fVar71 + fVar67;
        fVar76 = fVar72 + fVar68;
        fVar52 = fVar55 * fVar41;
        fVar53 = fVar55 * fVar44;
        fVar54 = fVar55 * fVar45;
        fVar55 = fVar55 * fVar50;
        fVar77 = fVar52 + fVar73;
        fVar79 = fVar53 + fVar74;
        fVar81 = fVar54 + fVar75;
        fVar84 = fVar55 + fVar76;
        auVar29._4_4_ = fVar79;
        auVar29._0_4_ = fVar77;
        auVar29._8_4_ = fVar81;
        auVar29._12_4_ = fVar84;
        auVar63 = minps(_DAT_01feb9f0,auVar29);
        auVar30._4_4_ = fVar79;
        auVar30._0_4_ = fVar77;
        auVar30._8_4_ = fVar81;
        auVar30._12_4_ = fVar84;
        auVar61 = maxps((undefined1  [16])aVar39,auVar30);
        fVar77 = auVar42._0_4_;
        fVar79 = auVar42._4_4_;
        fVar81 = auVar42._8_4_;
        fVar56 = fVar81 * fVar46 + fVar56;
        fVar58 = fVar81 * fVar48 + fVar58;
        fVar59 = fVar81 * fVar49 + fVar59;
        fVar60 = fVar81 * fVar51 + fVar60;
        fVar69 = fVar69 + fVar56;
        fVar70 = fVar70 + fVar58;
        fVar71 = fVar71 + fVar59;
        fVar72 = fVar72 + fVar60;
        fVar46 = fVar52 + fVar69;
        fVar48 = fVar53 + fVar70;
        fVar49 = fVar54 + fVar71;
        fVar51 = fVar55 + fVar72;
        auVar10._4_4_ = fVar48;
        auVar10._0_4_ = fVar46;
        auVar10._8_4_ = fVar49;
        auVar10._12_4_ = fVar51;
        auVar42 = minps(auVar63,auVar10);
        auVar11._4_4_ = fVar48;
        auVar11._0_4_ = fVar46;
        auVar11._8_4_ = fVar49;
        auVar11._12_4_ = fVar51;
        auVar63 = maxps(auVar61,auVar11);
        fVar78 = fVar79 * fVar78;
        fVar80 = fVar79 * fVar80;
        fVar82 = fVar79 * fVar82;
        fVar79 = fVar79 * fVar47;
        fVar62 = fVar62 + fVar78;
        fVar66 = fVar66 + fVar80;
        fVar67 = fVar67 + fVar82;
        fVar68 = fVar68 + fVar79;
        fVar47 = fVar52 + fVar62;
        fVar46 = fVar53 + fVar66;
        fVar48 = fVar54 + fVar67;
        fVar49 = fVar55 + fVar68;
        auVar12._4_4_ = fVar46;
        auVar12._0_4_ = fVar47;
        auVar12._8_4_ = fVar48;
        auVar12._12_4_ = fVar49;
        auVar42 = minps(auVar42,auVar12);
        auVar13._4_4_ = fVar46;
        auVar13._0_4_ = fVar47;
        auVar13._8_4_ = fVar48;
        auVar13._12_4_ = fVar49;
        auVar63 = maxps(auVar63,auVar13);
        fVar78 = fVar78 + fVar56;
        fVar80 = fVar80 + fVar58;
        fVar82 = fVar82 + fVar59;
        fVar79 = fVar79 + fVar60;
        fVar52 = fVar52 + fVar78;
        fVar53 = fVar53 + fVar80;
        fVar54 = fVar54 + fVar82;
        fVar55 = fVar55 + fVar79;
        auVar14._4_4_ = fVar53;
        auVar14._0_4_ = fVar52;
        auVar14._8_4_ = fVar54;
        auVar14._12_4_ = fVar55;
        auVar42 = minps(auVar42,auVar14);
        auVar15._4_4_ = fVar53;
        auVar15._0_4_ = fVar52;
        auVar15._8_4_ = fVar54;
        auVar15._12_4_ = fVar55;
        auVar63 = maxps(auVar63,auVar15);
        fVar41 = fVar77 * fVar41;
        fVar44 = fVar77 * fVar44;
        fVar45 = fVar77 * fVar45;
        fVar77 = fVar77 * fVar50;
        fVar73 = fVar73 + fVar41;
        fVar74 = fVar74 + fVar44;
        fVar75 = fVar75 + fVar45;
        fVar76 = fVar76 + fVar77;
        auVar27._4_4_ = fVar74;
        auVar27._0_4_ = fVar73;
        auVar27._8_4_ = fVar75;
        auVar27._12_4_ = fVar76;
        auVar42 = minps(auVar42,auVar27);
        auVar28._4_4_ = fVar74;
        auVar28._0_4_ = fVar73;
        auVar28._8_4_ = fVar75;
        auVar28._12_4_ = fVar76;
        auVar63 = maxps(auVar63,auVar28);
        fVar69 = fVar69 + fVar41;
        fVar70 = fVar70 + fVar44;
        fVar71 = fVar71 + fVar45;
        fVar72 = fVar72 + fVar77;
        auVar23._4_4_ = fVar70;
        auVar23._0_4_ = fVar69;
        auVar23._8_4_ = fVar71;
        auVar23._12_4_ = fVar72;
        auVar42 = minps(auVar42,auVar23);
        auVar24._4_4_ = fVar70;
        auVar24._0_4_ = fVar69;
        auVar24._8_4_ = fVar71;
        auVar24._12_4_ = fVar72;
        auVar63 = maxps(auVar63,auVar24);
        auVar64._0_4_ = fVar62 + fVar41;
        auVar64._4_4_ = fVar66 + fVar44;
        auVar64._8_4_ = fVar67 + fVar45;
        auVar64._12_4_ = fVar68 + fVar77;
        auVar42 = minps(auVar42,auVar64);
        auVar63 = maxps(auVar63,auVar64);
        auVar43._0_4_ = fVar41 + fVar78;
        auVar43._4_4_ = fVar44 + fVar80;
        auVar43._8_4_ = fVar45 + fVar82;
        auVar43._12_4_ = fVar77 + fVar79;
        auVar42 = minps(auVar42,auVar43);
        auVar63 = maxps(auVar63,auVar43);
      }
      aVar37.m128 = (__m128)maxps(aVar37.m128,auVar63);
      auVar40 = minps(auVar40,auVar42);
      auVar38 = auVar40._0_12_;
      uVar4 = this->geomID_;
      *(Instance **)(pcVar32 + lVar36) = pIVar7;
      *(uint *)(pcVar32 + lVar36 + 8) = uVar4;
      lVar36 = lVar36 + 0x10;
    } while ((local_88 + (local_88 == 0)) * 0x10 != lVar36);
  }
  uVar33 = 7;
  if (local_88 < 7) {
    uVar33 = local_88;
  }
  aVar39.m128[3] = (float)(piVar31[1] - *piVar31);
  aVar39._0_12_ = auVar38;
  (__return_storage_ptr__->ref).ptr = uVar33 | (ulong)pcVar32 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar39;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar37;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);
        
        /* allocate leaf node */
        InstancePrimitive* accel = (InstancePrimitive*) alloc.malloc1(items*sizeof(InstancePrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const Instance* instance = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index; 
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstancePrimitive(instance, geomID_);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }